

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_duplicate_set.c
# Opt level: O1

oonf_duplicate_result
oonf_duplicate_entry_add
          (oonf_duplicate_set *set,uint8_t msg_type,netaddr *originator,uint64_t seqno,
          uint64_t vtime)

{
  undefined2 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  oonf_duplicate_result oVar6;
  long lVar7;
  undefined8 uVar8;
  ulong uVar9;
  oonf_duplicate_entry *entry;
  oonf_duplicate_entry_key key;
  netaddr_str nbuf;
  
  uVar2 = *(undefined4 *)originator->_addr;
  uVar3 = *(undefined4 *)(originator->_addr + 4);
  uVar4 = *(undefined4 *)(originator->_addr + 8);
  uVar5 = *(undefined4 *)(originator->_addr + 0xc);
  uVar1._0_1_ = originator->_type;
  uVar1._1_1_ = originator->_prefix_len;
  lVar7 = avl_find();
  if (lVar7 == 0) {
    entry = (oonf_duplicate_entry *)oonf_class_malloc(&_dupset_class);
    if (entry == (oonf_duplicate_entry *)0x0) {
      return OONF_DUPSET_TOO_OLD;
    }
    entry->current = seqno;
    entry->history = 1;
    entry->set = set;
    (entry->_vtime).class = &_vtime_info;
    oonf_timer_start_ext(&entry->_vtime,vtime,vtime);
    key.addr._addr[0xf] = (uint8_t)((uint)uVar5 >> 0x18);
    *(uint *)((entry->key).addr._addr + 0xf) =
         CONCAT13(msg_type,CONCAT21(uVar1,key.addr._addr[0xf]));
    *(undefined4 *)(entry->key).addr._addr = uVar2;
    *(undefined4 *)((entry->key).addr._addr + 4) = uVar3;
    *(undefined4 *)((entry->key).addr._addr + 8) = uVar4;
    *(undefined4 *)((entry->key).addr._addr + 0xc) = uVar5;
    (entry->_node).key = entry;
    avl_insert(set,&entry->_node);
    oVar6 = OONF_DUPSET_FIRST;
  }
  else {
    entry = (oonf_duplicate_entry *)(lVar7 + -0x38);
    oVar6 = _test(set,entry,seqno,true);
  }
  uVar9 = (ulong)_oonf_duplicate_set_subsystem.logging;
  if (((&log_global_mask)[uVar9] & 1) != 0) {
    uVar8 = netaddr_to_prefixstring(&nbuf,originator,0);
    oonf_log(1,uVar9,"src/base/oonf_duplicate_set.c",0xde,0,0,
             "Test/Add msgtype %u, originator %s, seqno %lu: %s",msg_type,uVar8,seqno,
             OONF_DUPSET_RESULT_STR[oVar6]);
  }
  if ((oVar6 < (OONF_DUPSET_NEWEST|OONF_DUPSET_NEW)) && ((0x34U >> (oVar6 & 0x1f) & 1) != 0)) {
    oonf_timer_set_ext(&entry->_vtime,vtime,vtime);
  }
  return oVar6;
}

Assistant:

enum oonf_duplicate_result
oonf_duplicate_entry_add(
  struct oonf_duplicate_set *set, uint8_t msg_type, struct netaddr *originator, uint64_t seqno, uint64_t vtime)
{
  struct oonf_duplicate_entry *entry;
  struct oonf_duplicate_entry_key key;
  enum oonf_duplicate_result result;

#ifdef OONF_LOG_DEBUG_INFO
  struct netaddr_str nbuf;
#endif

  /* generate combined key */
  memcpy(&key.addr, originator, sizeof(*originator));
  key.msg_type = msg_type;

  entry = avl_find_element(&set->_tree, &key, entry, _node);
  if (!entry) {
    entry = oonf_class_malloc(&_dupset_class);
    if (entry == NULL) {
      return OONF_DUPSET_TOO_OLD;
    }

    /* initialize history and current sequence number */
    entry->current = seqno;
    entry->history = 1;

    /* initialize backpointer */
    entry->set = set;

    /* initialize vtime */
    entry->_vtime.class = &_vtime_info;

    oonf_timer_start(&entry->_vtime, vtime);

    /* set key and link entry to set */
    memcpy(&entry->key, &key, sizeof(key));
    entry->_node.key = &entry->key;
    avl_insert(&set->_tree, &entry->_node);

    result = OONF_DUPSET_FIRST;
  }
  else {
    result = _test(set, entry, seqno, true);
  }
  OONF_DEBUG(LOG_DUPLICATE_SET, "Test/Add msgtype %u, originator %s, seqno %" PRIu64 ": %s", msg_type,
    netaddr_to_string(&nbuf, originator), seqno, OONF_DUPSET_RESULT_STR[result]);

  if (oonf_duplicate_is_new(result)) {
    /* reset validity timer */
    oonf_timer_set(&entry->_vtime, vtime);
  }
  return result;
}